

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

TestInfo * __thiscall testing::UnitTest::current_test_info(UnitTest *this)

{
  TestInfo *pTVar1;
  GTestMutexLock local_18;
  MutexLock lock;
  UnitTest *this_local;
  
  lock.mutex_ = (MutexBase *)this;
  internal::GTestMutexLock::GTestMutexLock(&local_18,&(this->mutex_).super_MutexBase);
  pTVar1 = internal::UnitTestImpl::current_test_info(this->impl_);
  internal::GTestMutexLock::~GTestMutexLock(&local_18);
  return pTVar1;
}

Assistant:

GTEST_LOCK_EXCLUDED_(mutex_) {
  internal::MutexLock lock(&mutex_);
  return impl_->current_test_info();
}